

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch.cpp
# Opt level: O2

timestamp_t duckdb::EpochSecOperator::Operation<double,duckdb::timestamp_t>(double sec)

{
  bool bVar1;
  ConversionException *this;
  allocator local_41;
  int64_t result;
  string local_38;
  
  bVar1 = TryCast::Operation<double,long>(sec * 1000000.0,&result,false);
  if (bVar1) {
    return (timestamp_t)result;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Epoch seconds out of range for TIMESTAMP WITH TIME ZONE",&local_41
            );
  ConversionException::ConversionException(this,&local_38);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE sec) {
		int64_t result;
		if (!TryCast::Operation(sec * Interval::MICROS_PER_SEC, result)) {
			throw ConversionException("Epoch seconds out of range for TIMESTAMP WITH TIME ZONE");
		}
		return timestamp_t(result);
	}